

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_expression.cpp
# Opt level: O2

void __thiscall
duckdb::Transformer::TransformExpressionList
          (Transformer *this,PGList *list,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *result)

{
  pointer *__ptr;
  optional_ptr<duckdb_libpgquery::PGNode,_true> target;
  optional_ptr<duckdb::Transformer,_true> local_38;
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_30;
  
  while (list = (PGList *)list->head, list != (PGList *)0x0) {
    local_30.ptr = *(PGNode **)list;
    optional_ptr<duckdb_libpgquery::PGNode,_true>::operator*(&stack0xffffffffffffffd0);
    TransformExpression((Transformer *)&stack0xffffffffffffffc8,(PGNode *)this);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)result,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&stack0xffffffffffffffc8);
    if (local_38.ptr != (Transformer *)0x0) {
      (*(code *)(((local_38.ptr)->parent).ptr)->options)();
    }
  }
  return;
}

Assistant:

void Transformer::TransformExpressionList(duckdb_libpgquery::PGList &list,
                                          vector<unique_ptr<ParsedExpression>> &result) {
	for (auto node = list.head; node != nullptr; node = node->next) {
		auto target = PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value);

		auto expr = TransformExpression(*target);
		result.push_back(std::move(expr));
	}
}